

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::OptHoistUpdateValueType
          (GlobOpt *this,Loop *loop,Instr *instr,Opnd **srcOpndPtr,Value *opndVal)

{
  Opnd *this_00;
  BasicBlock *block;
  Func *func;
  ValueInfo *pVVar1;
  Instr *this_01;
  code *pcVar2;
  Loop *pLVar3;
  bool bVar4;
  byte bVar5;
  OpndKind OVar6;
  Sym *sym;
  Value *pVVar7;
  undefined4 *puVar8;
  GlobOptBlockData *this_02;
  Opnd *src1Opnd;
  Instr *pIVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Loop *local_48;
  GlobOptBlockData *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType opndValueTypeInLandingPad;
  
  if ((((opndVal == (Value *)0x0) || (srcOpndPtr == (Opnd **)0x0)) || (instr->m_opcode == FromVar))
     || (this_00 = *srcOpndPtr, this_00 == (Opnd *)0x0)) {
    return;
  }
  local_48 = loop;
  sym = IR::Opnd::GetSym(this_00);
  if (sym == (Sym *)0x0) {
    return;
  }
  block = local_48->landingPad;
  local_40 = &block->globOptData;
  pVVar7 = GlobOptBlockData::FindValue(local_40,sym);
  if (opndVal->valueNumber != pVVar7->valueNumber) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,14999,
                       "(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber())",
                       "opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber()");
    if (!bVar4) goto LAB_0046f7a2;
    *puVar8 = 0;
  }
  local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)
                *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                 &(pVVar7->valueInfo->super_ValueType).field_0.field_0;
  local_4a = (this_00->m_valueType).field_0;
  bVar4 = ValueType::operator!=((ValueType *)&local_4a.field_0,(ValueType)local_32[0]);
  if ((!bVar4) ||
     (IR::Opnd::SetValueType(this_00,(ValueType)local_32[0].field_0),
     instr->m_opcode != SetConcatStrMultiItemBE)) {
    if (sym->m_kind != SymKindProperty) {
      return;
    }
    pVVar7 = GlobOptBlockData::FindValue(local_40,sym[1].m_next);
    pVVar1 = pVVar7->valueInfo;
    OVar6 = IR::Opnd::GetKind(this_00);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_0046f7a2;
      *puVar8 = 0;
    }
    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_00[1].m_kind =
         (pVVar1->super_ValueType).field_0;
    return;
  }
  if (sym->m_kind == SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa1,"(!opndSym->IsPropertySym())","!opndSym->IsPropertySym()");
    if (!bVar4) goto LAB_0046f7a2;
    *puVar8 = 0;
  }
  bVar4 = ValueType::IsString((ValueType *)&local_32[0].field_0);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa2,"(!opndValueTypeInLandingPad.IsString())",
                       "!opndValueTypeInLandingPad.IsString()");
    if (!bVar4) goto LAB_0046f7a2;
    *puVar8 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3aa3,"(instr->GetDst())","instr->GetDst()");
    if (!bVar4) goto LAB_0046f7a2;
    *puVar8 = 0;
  }
  this_02 = (GlobOptBlockData *)IR::RegOpnd::New(TyVar,instr->m_func);
  IR::Opnd::SetValueType((Opnd *)this_02,(ValueType)0x800);
  *(undefined1 *)((long)((ValueType *)&this_02->exprToValueMap + 1) + 1) =
       *(undefined1 *)((long)((ValueType *)&this_02->exprToValueMap + 1) + 1) | 1;
  func = instr->m_func;
  if (this_00->isDeleted == true) {
    AssertCount = AssertCount + 1;
    local_40 = this_02;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_0046f7a2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
    this_02 = local_40;
  }
  bVar5 = this_00->field_0xb;
  src1Opnd = this_00;
  if ((bVar5 & 2) != 0) {
    src1Opnd = IR::Opnd::Copy(this_00,func);
    bVar5 = src1Opnd->field_0xb;
  }
  src1Opnd->field_0xb = bVar5 | 2;
  pIVar9 = IR::Instr::New(Conv_PrimStr,(Opnd *)this_02,src1Opnd,instr->m_func);
  IR::Instr::ReplaceSrc(instr,this_00,(Opnd *)this_02);
  *srcOpndPtr = (Opnd *)this_02;
  pBVar10 = (block->globOptData).liveFields;
  do {
    pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
    if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
  } while (((Type *)&pBVar10->alloc)->word == 0);
  bVar4 = IsImplicitCallBailOutCurrentlyNeeded
                    (this,pIVar9,pVVar7,(Value *)0x0,block,
                     pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0,true,true,false);
  pLVar3 = local_48;
  if (bVar4) {
    EnsureBailTarget(this,local_48);
    IR::Instr::InsertBefore(pLVar3->bailOutInfo->bailOutInstr,pIVar9);
    pIVar9 = IR::Instr::ConvertToBailOutInstr
                       (pIVar9,pIVar9,BailOutOnImplicitCallsPreOp,pLVar3->bailOutInfo->bailOutOffset
                       );
    IR::Instr::ReplaceBailOutInfo(pIVar9,pLVar3->bailOutInfo);
    return;
  }
  this_01 = local_48->bailOutInfo->bailOutInstr;
  if (this_01 == (Instr *)0x0) {
    BasicBlock::InsertAfter(block,pIVar9);
    return;
  }
  IR::Instr::InsertBefore(this_01,pIVar9);
  return;
}

Assistant:

void
GlobOpt::OptHoistUpdateValueType(
    Loop* loop,
    IR::Instr* instr,
    IR::Opnd** srcOpndPtr /* All code paths that change src, should update srcOpndPtr*/,
    Value* opndVal)
{
    if (opndVal == nullptr || instr->m_opcode == Js::OpCode::FromVar || srcOpndPtr == nullptr || *srcOpndPtr == nullptr)
    {
        return;
    }

    IR::Opnd* srcOpnd = *srcOpndPtr;

    Sym* opndSym = srcOpnd->GetSym();;

    if (opndSym)
    {
        BasicBlock* landingPad = loop->landingPad;
        Value* opndValueInLandingPad = landingPad->globOptData.FindValue(opndSym);
        Assert(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber());

        ValueType opndValueTypeInLandingPad = opndValueInLandingPad->GetValueInfo()->Type();

        if (srcOpnd->GetValueType() != opndValueTypeInLandingPad)
        {
            srcOpnd->SetValueType(opndValueTypeInLandingPad);

            if (instr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)
            {
                Assert(!opndSym->IsPropertySym());
                Assert(!opndValueTypeInLandingPad.IsString());
                Assert(instr->GetDst());

                IR::RegOpnd* strOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
                strOpnd->SetValueType(ValueType::String);
                strOpnd->SetValueTypeFixed();
                IR::Instr* convPrimStrInstr =
                    IR::Instr::New(Js::OpCode::Conv_PrimStr, strOpnd, srcOpnd->Use(instr->m_func), instr->m_func);
                instr->ReplaceSrc(srcOpnd, strOpnd);

                // Replace above will free srcOpnd, so reassign it
                *srcOpndPtr = srcOpnd = reinterpret_cast<IR::Opnd *>(strOpnd);

                // We add ConvPrim_Str in the landingpad, and since this instruction doesn't go through the checks in OptInstr, the bailout is never added
                // As we expand hoisting of instructions to new opcode, we need a better framework to handle such cases
                if (IsImplicitCallBailOutCurrentlyNeeded(convPrimStrInstr, opndValueInLandingPad, nullptr, landingPad, landingPad->globOptData.liveFields->IsEmpty(), true, true))
                {
                    EnsureBailTarget(loop);
                    loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    convPrimStrInstr = convPrimStrInstr->ConvertToBailOutInstr(convPrimStrInstr, IR::BailOutOnImplicitCallsPreOp, loop->bailOutInfo->bailOutOffset);
                    convPrimStrInstr->ReplaceBailOutInfo(loop->bailOutInfo);
                }
                else
                {
                    if (loop->bailOutInfo->bailOutInstr)
                    {
                        loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    }
                    else
                    {
                        landingPad->InsertAfter(convPrimStrInstr);
                    }
                }

                // If we came here opndSym can't be PropertySym
                return;
            }
        }


        if (opndSym->IsPropertySym())
        {
            // Also fix valueInfo on objPtr
            StackSym* opndObjPtrSym = opndSym->AsPropertySym()->m_stackSym;
            Value* opndObjPtrSymValInLandingPad = landingPad->globOptData.FindValue(opndObjPtrSym);
            ValueInfo* opndObjPtrSymValueInfoInLandingPad = opndObjPtrSymValInLandingPad->GetValueInfo();

            srcOpnd->AsSymOpnd()->SetPropertyOwnerValueType(opndObjPtrSymValueInfoInLandingPad->Type());
        }
    }
}